

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O3

AggregateInitialiserList * __thiscall
soul::HEARTGenerator::createAggregateInitialiserList
          (HEARTGenerator *this,Context *context,Type *targetType,CommaSeparatedList *list)

{
  Member *pMVar1;
  Member *pMVar2;
  size_t sVar3;
  pool_ref<soul::AST::Expression> *ppVar4;
  AggregateInitialiserList *pAVar5;
  Structure *pSVar6;
  Expression *pEVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  Type elementType;
  Type local_a0;
  ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> *local_88;
  pool_ref<soul::AST::Expression> *local_80;
  HEARTGenerator *local_78;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> local_70;
  pool_ptr<soul::AST::Expression> local_38;
  
  local_78 = this;
  pAVar5 = PoolAllocator::
           allocate<soul::heart::AggregateInitialiserList,soul::CodeLocation_const&,soul::Type_const&>
                     (&this->module->allocator->pool,&context->location,targetType);
  local_38.object = &list->super_Expression;
  AST::CommaSeparatedList::getAsExpressionList(&local_70,&local_38);
  if (local_70.numActive != 0) {
    local_80 = local_70.items;
    local_88 = &pAVar5->items;
    lVar10 = local_70.numActive << 3;
    uVar9 = 0;
    do {
      if (targetType->category == structure) {
        pSVar6 = Type::getStructRef(targetType);
        uVar8 = uVar9 & 0xffffffff;
        if ((pSVar6->members).numActive <= uVar8) {
          throwInternalCompilerError("index < numActive","operator[]",0x9f);
        }
        pMVar2 = (pSVar6->members).items;
        pMVar1 = pMVar2 + uVar8;
        local_a0.category = (pMVar1->type).category;
        local_a0.arrayElementCategory = (pMVar1->type).arrayElementCategory;
        local_a0.isRef = (pMVar1->type).isRef;
        local_a0.isConstant = (pMVar1->type).isConstant;
        local_a0.primitiveType.type = pMVar2[uVar8].type.primitiveType.type;
        local_a0.boundingSize = pMVar2[uVar8].type.boundingSize;
        local_a0.arrayElementBoundingSize = pMVar2[uVar8].type.arrayElementBoundingSize;
        local_a0.structure.object = pMVar2[uVar8].type.structure.object;
        if (local_a0.structure.object != (Structure *)0x0) {
          ((local_a0.structure.object)->super_RefCountedObject).refCount =
               ((local_a0.structure.object)->super_RefCountedObject).refCount + 1;
        }
      }
      else {
        Type::getElementType(&local_a0,targetType);
      }
      ppVar4 = local_80;
      SanityCheckPass::expectSilentCastPossible
                (&((local_80[uVar9].object)->super_Statement).super_ASTObject.context,&local_a0,
                 local_80[uVar9].object);
      pEVar7 = evaluateAsExpression(local_78,ppVar4[uVar9].object,&local_a0);
      ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::reserve
                (local_88,(pAVar5->items).numActive + 1);
      sVar3 = (pAVar5->items).numActive;
      (pAVar5->items).items[sVar3].object = pEVar7;
      (pAVar5->items).numActive = sVar3 + 1;
      RefCountedPtr<soul::Structure>::decIfNotNull(local_a0.structure.object);
      uVar9 = uVar9 + 1;
      lVar10 = lVar10 + -8;
    } while (lVar10 != 0);
  }
  local_70.numActive = 0;
  if ((4 < local_70.numAllocated) && (local_70.items != (pool_ref<soul::AST::Expression> *)0x0)) {
    operator_delete__(local_70.items);
  }
  return pAVar5;
}

Assistant:

heart::AggregateInitialiserList& createAggregateInitialiserList (const AST::Context& context, const Type& targetType, AST::CommaSeparatedList& list)
    {
        auto& result = module.allocator.allocate<heart::AggregateInitialiserList> (context.location, targetType);
        uint32_t index = 0;

        for (auto& item : AST::CommaSeparatedList::getAsExpressionList (list))
        {
            auto elementType = targetType.isStruct() ? targetType.getStructRef().getMemberType (index)
                                                     : targetType.getElementType();

            SanityCheckPass::expectSilentCastPossible (item->context, elementType, item);
            result.items.push_back (evaluateAsExpression (item, elementType));
            ++index;
        }

        return result;
    }